

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopInsert(WhereLoopBuilder *pBuilder,WhereLoop *pTemplate)

{
  byte *pbVar1;
  u8 uVar2;
  undefined2 uVar3;
  short sVar4;
  undefined2 uVar5;
  short sVar6;
  WhereInfo *pWVar7;
  sqlite3 *db;
  WhereLoop *p;
  Index *pIVar8;
  Bitmask BVar9;
  Bitmask BVar10;
  undefined8 uVar11;
  ExprList *pEVar12;
  u16 uVar13;
  u16 uVar14;
  u8 uVar15;
  LogEst LVar16;
  LogEst LVar17;
  LogEst LVar18;
  int iVar19;
  WhereLoop **ppWVar20;
  WhereLoop *pWVar21;
  
  if (pBuilder->iPlanLimit == 0) {
    iVar19 = 0x65;
    if (pBuilder->pOrSet != (WhereOrSet *)0x0) {
      pBuilder->pOrSet->n = 0;
    }
  }
  else {
    pWVar7 = pBuilder->pWInfo;
    db = pWVar7->pParse->db;
    pBuilder->iPlanLimit = pBuilder->iPlanLimit - 1;
    pWVar21 = pWVar7->pLoops;
    if ((pWVar21 != (WhereLoop *)0x0) && ((pTemplate->wsFlags & 0x200) != 0)) {
      uVar2 = pTemplate->iTab;
      do {
        if ((pWVar21->iTab == uVar2) && ((pWVar21->wsFlags & 0x200) != 0)) {
          iVar19 = whereLoopCheaperProperSubset(pWVar21,pTemplate);
          if (iVar19 == 0) {
            iVar19 = whereLoopCheaperProperSubset(pTemplate,pWVar21);
            if (iVar19 == 0) goto LAB_0019c523;
            uVar5 = pWVar21->rRun;
            sVar6 = pTemplate->rRun;
            if (sVar6 < (short)uVar5) {
              sVar6 = uVar5;
            }
            pTemplate->rRun = sVar6;
            sVar6 = pWVar21->nOut + 1;
            if (pWVar21->nOut < pTemplate->nOut) {
              sVar6 = pTemplate->nOut;
            }
          }
          else {
            uVar3 = pWVar21->rRun;
            sVar4 = pTemplate->rRun;
            if ((short)uVar3 < sVar4) {
              sVar4 = uVar3;
            }
            pTemplate->rRun = sVar4;
            sVar6 = pWVar21->nOut + -1;
            if (pTemplate->nOut < pWVar21->nOut) {
              sVar6 = pTemplate->nOut;
            }
          }
          pTemplate->nOut = sVar6;
        }
LAB_0019c523:
        pWVar21 = pWVar21->pNextLoop;
      } while (pWVar21 != (WhereLoop *)0x0);
    }
    if (pBuilder->pOrSet == (WhereOrSet *)0x0) {
      ppWVar20 = whereLoopFindLesser(&pWVar7->pLoops,pTemplate);
      if (ppWVar20 == (WhereLoop **)0x0) {
        iVar19 = 0;
      }
      else {
        pWVar21 = *ppWVar20;
        if (pWVar21 == (WhereLoop *)0x0) {
          pWVar21 = (WhereLoop *)sqlite3DbMallocRawNN(db,0x68);
          *ppWVar20 = pWVar21;
          if (pWVar21 == (WhereLoop *)0x0) {
            return 7;
          }
          pWVar21->aLTerm = pWVar21->aLTermSpace;
          pWVar21->nLTerm = 0;
          pWVar21->nLSlot = 3;
          pWVar21->wsFlags = 0;
          pWVar21->pNextLoop = (WhereLoop *)0x0;
        }
        else if (pWVar21->pNextLoop != (WhereLoop *)0x0) {
          ppWVar20 = &pWVar21->pNextLoop;
          do {
            ppWVar20 = whereLoopFindLesser(ppWVar20,pTemplate);
            if ((ppWVar20 == (WhereLoop **)0x0) || (p = *ppWVar20, p == (WhereLoop *)0x0)) break;
            *ppWVar20 = p->pNextLoop;
            whereLoopClear(db,p);
            sqlite3DbNNFreeNN(db,p);
          } while (*ppWVar20 != (WhereLoop *)0x0);
        }
        whereLoopClearUnion(db,pWVar21);
        if ((pWVar21->nLSlot < pTemplate->nLTerm) &&
           (iVar19 = whereLoopResize(db,pWVar21,(uint)pTemplate->nLTerm), iVar19 != 0)) {
          (pWVar21->u).btree.pIndex = (Index *)0x0;
          (pWVar21->u).btree.pOrderBy = (ExprList *)0x0;
          pWVar21->iTab = '\0';
          pWVar21->iSortIdx = '\0';
          pWVar21->rSetup = 0;
          pWVar21->rRun = 0;
          pWVar21->nOut = 0;
          *(undefined8 *)&pWVar21->u = 0;
          pWVar21->prereq = 0;
          pWVar21->maskSelf = 0;
          pWVar21->wsFlags = 0;
          pWVar21->nLTerm = 0;
          pWVar21->nSkip = 0;
          iVar19 = 7;
        }
        else {
          uVar13 = pTemplate->nLTerm;
          uVar14 = pTemplate->nSkip;
          pWVar21->wsFlags = pTemplate->wsFlags;
          pWVar21->nLTerm = uVar13;
          pWVar21->nSkip = uVar14;
          BVar9 = pTemplate->prereq;
          BVar10 = pTemplate->maskSelf;
          uVar2 = pTemplate->iTab;
          uVar15 = pTemplate->iSortIdx;
          LVar16 = pTemplate->rSetup;
          LVar17 = pTemplate->rRun;
          LVar18 = pTemplate->nOut;
          uVar11 = *(undefined8 *)&pTemplate->u;
          pEVar12 = (pTemplate->u).btree.pOrderBy;
          (pWVar21->u).btree.pIndex = (pTemplate->u).btree.pIndex;
          (pWVar21->u).btree.pOrderBy = pEVar12;
          pWVar21->iTab = uVar2;
          pWVar21->iSortIdx = uVar15;
          pWVar21->rSetup = LVar16;
          pWVar21->rRun = LVar17;
          pWVar21->nOut = LVar18;
          *(undefined8 *)&pWVar21->u = uVar11;
          pWVar21->prereq = BVar9;
          pWVar21->maskSelf = BVar10;
          memcpy(pWVar21->aLTerm,pTemplate->aLTerm,(ulong)pWVar21->nLTerm << 3);
          if ((pTemplate->wsFlags >> 10 & 1) == 0) {
            iVar19 = 0;
            if ((pTemplate->wsFlags >> 0xe & 1) != 0) {
              (pTemplate->u).btree.pIndex = (Index *)0x0;
              iVar19 = 0;
            }
          }
          else {
            pbVar1 = (byte *)((long)&pTemplate->u + 4);
            *pbVar1 = *pbVar1 & 0xfe;
            iVar19 = 0;
          }
        }
        if ((((pWVar21->wsFlags & 0x400) == 0) &&
            (pIVar8 = (pWVar21->u).btree.pIndex, pIVar8 != (Index *)0x0)) &&
           ((~*(ushort *)&pIVar8->field_0x63 & 3) == 0)) {
          (pWVar21->u).btree.pIndex = (Index *)0x0;
        }
      }
    }
    else {
      iVar19 = 0;
      if (pTemplate->nLTerm != 0) {
        whereOrInsert(pBuilder->pOrSet,pTemplate->prereq,pTemplate->rRun,pTemplate->nOut);
        iVar19 = 0;
      }
    }
  }
  return iVar19;
}

Assistant:

static int whereLoopInsert(WhereLoopBuilder *pBuilder, WhereLoop *pTemplate){
  WhereLoop **ppPrev, *p;
  WhereInfo *pWInfo = pBuilder->pWInfo;
  sqlite3 *db = pWInfo->pParse->db;
  int rc;

  /* Stop the search once we hit the query planner search limit */
  if( pBuilder->iPlanLimit==0 ){
    WHERETRACE(0xffffffff,("=== query planner search limit reached ===\n"));
    if( pBuilder->pOrSet ) pBuilder->pOrSet->n = 0;
    return SQLITE_DONE;
  }
  pBuilder->iPlanLimit--;

  whereLoopAdjustCost(pWInfo->pLoops, pTemplate);

  /* If pBuilder->pOrSet is defined, then only keep track of the costs
  ** and prereqs.
  */
  if( pBuilder->pOrSet!=0 ){
    if( pTemplate->nLTerm ){
#if WHERETRACE_ENABLED
      u16 n = pBuilder->pOrSet->n;
      int x =
#endif
      whereOrInsert(pBuilder->pOrSet, pTemplate->prereq, pTemplate->rRun,
                                    pTemplate->nOut);
#if WHERETRACE_ENABLED /* 0x8 */
      if( sqlite3WhereTrace & 0x8 ){
        sqlite3DebugPrintf(x?"   or-%d:  ":"   or-X:  ", n);
        sqlite3WhereLoopPrint(pTemplate, pBuilder->pWC);
      }
#endif
    }
    return SQLITE_OK;
  }

  /* Look for an existing WhereLoop to replace with pTemplate
  */
  ppPrev = whereLoopFindLesser(&pWInfo->pLoops, pTemplate);

  if( ppPrev==0 ){
    /* There already exists a WhereLoop on the list that is better
    ** than pTemplate, so just ignore pTemplate */
#if WHERETRACE_ENABLED /* 0x8 */
    if( sqlite3WhereTrace & 0x8 ){
      sqlite3DebugPrintf("   skip: ");
      sqlite3WhereLoopPrint(pTemplate, pBuilder->pWC);
    }
#endif
    return SQLITE_OK;
  }else{
    p = *ppPrev;
  }

  /* If we reach this point it means that either p[] should be overwritten
  ** with pTemplate[] if p[] exists, or if p==NULL then allocate a new
  ** WhereLoop and insert it.
  */
#if WHERETRACE_ENABLED /* 0x8 */
  if( sqlite3WhereTrace & 0x8 ){
    if( p!=0 ){
      sqlite3DebugPrintf("replace: ");
      sqlite3WhereLoopPrint(p, pBuilder->pWC);
      sqlite3DebugPrintf("   with: ");
    }else{
      sqlite3DebugPrintf("    add: ");
    }
    sqlite3WhereLoopPrint(pTemplate, pBuilder->pWC);
  }
#endif
  if( p==0 ){
    /* Allocate a new WhereLoop to add to the end of the list */
    *ppPrev = p = sqlite3DbMallocRawNN(db, sizeof(WhereLoop));
    if( p==0 ) return SQLITE_NOMEM_BKPT;
    whereLoopInit(p);
    p->pNextLoop = 0;
  }else{
    /* We will be overwriting WhereLoop p[].  But before we do, first
    ** go through the rest of the list and delete any other entries besides
    ** p[] that are also supplanted by pTemplate */
    WhereLoop **ppTail = &p->pNextLoop;
    WhereLoop *pToDel;
    while( *ppTail ){
      ppTail = whereLoopFindLesser(ppTail, pTemplate);
      if( ppTail==0 ) break;
      pToDel = *ppTail;
      if( pToDel==0 ) break;
      *ppTail = pToDel->pNextLoop;
#if WHERETRACE_ENABLED /* 0x8 */
      if( sqlite3WhereTrace & 0x8 ){
        sqlite3DebugPrintf(" delete: ");
        sqlite3WhereLoopPrint(pToDel, pBuilder->pWC);
      }
#endif
      whereLoopDelete(db, pToDel);
    }
  }
  rc = whereLoopXfer(db, p, pTemplate);
  if( (p->wsFlags & WHERE_VIRTUALTABLE)==0 ){
    Index *pIndex = p->u.btree.pIndex;
    if( pIndex && pIndex->idxType==SQLITE_IDXTYPE_IPK ){
      p->u.btree.pIndex = 0;
    }
  }
  return rc;
}